

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GreenCard.cpp
# Opt level: O0

int __thiscall GreenCard::addBonus(GreenCard *this,int money,int honour)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  ostream *poVar4;
  string local_80 [8];
  string ans_1;
  Item *temp_1;
  string local_48 [8];
  string ans;
  Follower *temp;
  int honour_local;
  int money_local;
  GreenCard *this_local;
  
  this_local._4_4_ = money;
  if (this->type == FOLLOWER) {
    iVar2 = Follower::getEffectCost((Follower *)this);
    if (money < iVar2) {
      poVar4 = std::operator<<((ostream *)&std::cout,"Not enough money");
      std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    }
    else {
      iVar2 = Follower::getMinimumHonor((Follower *)this);
      if (honour < iVar2) {
        poVar4 = std::operator<<((ostream *)&std::cout,"Not honourable enough");
        std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
      }
      else {
        poVar4 = std::operator<<((ostream *)&std::cout,"Do you want to upgrade your card ");
        poVar4 = std::operator<<(poVar4,(string *)&this->name);
        poVar4 = std::operator<<(poVar4,"?");
        std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
        poVar4 = std::operator<<((ostream *)&std::cout,"Cost: ");
        iVar2 = Follower::getEffectCost((Follower *)this);
        poVar4 = (ostream *)std::ostream::operator<<(poVar4,iVar2);
        poVar4 = (ostream *)std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
        poVar4 = std::operator<<(poVar4,"Bonus: ");
        iVar2 = Follower::getEffectBonus((Follower *)this);
        poVar4 = (ostream *)std::ostream::operator<<(poVar4,iVar2);
        std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
        poVar4 = std::operator<<((ostream *)&std::cout,"Enter y for yes, n for no");
        std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
        std::__cxx11::string::string(local_48);
        std::operator>>((istream *)&std::cin,local_48);
        bVar1 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )local_48,"n");
        if (!bVar1) {
          iVar2 = Follower::getAttackBonus((Follower *)this);
          iVar3 = Follower::getEffectCost((Follower *)this);
          Follower::setAttackBonus((Follower *)this,iVar2 + iVar3);
          iVar2 = Follower::getDefenseBonus((Follower *)this);
          iVar3 = Follower::getEffectBonus((Follower *)this);
          Follower::setDefenseBonus((Follower *)this,iVar2 + iVar3);
          iVar2 = Follower::getEffectCost((Follower *)this);
          this_local._4_4_ = money - iVar2;
        }
        std::__cxx11::string::~string(local_48);
      }
    }
  }
  else if ((this->cost <= money) && (this->minimumHonor <= honour)) {
    poVar4 = std::operator<<((ostream *)&std::cout,"Do you want to upgrade your card ");
    poVar4 = std::operator<<(poVar4,(string *)&this->name);
    poVar4 = std::operator<<(poVar4,"?");
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    poVar4 = std::operator<<((ostream *)&std::cout,"Cost: ");
    iVar2 = Item::getEffectCost((Item *)this);
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,iVar2);
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    poVar4 = std::operator<<(poVar4,"Bonus: ");
    iVar2 = Item::getEffectBonus((Item *)this);
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,iVar2);
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    poVar4 = std::operator<<((ostream *)&std::cout,"Enter y for yes, n for no");
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    std::__cxx11::string::string(local_80);
    std::operator>>((istream *)&std::cin,local_80);
    bVar1 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_80,"n");
    if (!bVar1) {
      iVar2 = Item::getAttackBonus((Item *)this);
      iVar3 = Item::getEffectCost((Item *)this);
      Item::setAttackBonus((Item *)this,iVar2 + iVar3);
      iVar2 = Item::getDefenseBonus((Item *)this);
      iVar3 = Item::getEffectBonus((Item *)this);
      Item::setDefenseBonus((Item *)this,iVar2 + iVar3);
      iVar2 = Item::getEffectCost((Item *)this);
      this_local._4_4_ = money - iVar2;
    }
    std::__cxx11::string::~string(local_80);
  }
  return this_local._4_4_;
}

Assistant:

int GreenCard::addBonus(int money, int honour)       //if bought adds bonuses and returns new amount of money of player, else returns same amount
{                                                    //casts to follower or item to have access to cards' data
    if (type == FOLLOWER)
    {
        Follower *temp = reinterpret_cast<Follower*>(this);

        if (money < temp->getEffectCost())
        {
            cout << "Not enough money"<<endl;
            return money;
        }
        if (honour < temp->getMinimumHonor())
        {
            cout << "Not honourable enough"<<endl;
            return money;
        }

        cout << "Do you want to upgrade your card "<< name <<"?" << endl;
        cout << "Cost: "<< temp->getEffectCost() <<endl << "Bonus: "<< temp->getEffectBonus()<<endl;
        cout <<"Enter y for yes, n for no"<< endl;
        string ans;
        cin >> ans;

        if (ans != "n")
            return money;

        //add bonuses to card stats
        temp->setAttackBonus(temp->getAttackBonus() + temp->getEffectCost());
        temp->setDefenseBonus(temp->getDefenseBonus() + temp->getEffectBonus());

        return money-temp->getEffectCost();
    }
    else
    {
        Item *temp = reinterpret_cast<Item*>(this);

        if (money < cost || honour < minimumHonor)
            return money;

        cout << "Do you want to upgrade your card "<< name <<"?" << endl;
        cout << "Cost: "<< temp->getEffectCost() <<endl << "Bonus: "<< temp->getEffectBonus()<<endl;
        cout <<"Enter y for yes, n for no"<< endl;
        string ans;
        cin >> ans;

        if (ans != "n")
            return money;

        //add bonuses to card stats
        temp->setAttackBonus(temp->getAttackBonus() + temp->getEffectCost());
        temp->setDefenseBonus(temp->getDefenseBonus() + temp->getEffectBonus());

        return money-temp->getEffectCost();
    }
}